

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::MakeFilesFullPath
          (cmInstallCommand *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  pointer pbVar9;
  bool bVar10;
  string file;
  ostringstream e;
  string local_208;
  cmInstallCommand *local_1e8;
  char *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  pbVar9 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar10 = pbVar9 == (relFiles->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar10) {
    paVar1 = &local_208.field_2;
    local_1e8 = this;
    local_1e0 = modeName;
    local_1d8 = absFiles;
    local_1d0 = relFiles;
    do {
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar2,pcVar2 + pbVar9->_M_string_length);
      sVar5 = cmGeneratorExpression::Find(&local_208);
      if (sVar5 != 0) {
        bVar4 = cmsys::SystemTools::FileIsFullPath(local_208._M_dataplus._M_p);
        if (!bVar4) {
          pcVar6 = cmMakefile::GetCurrentSourceDirectory((local_1e8->super_cmCommand).Makefile);
          sVar3 = local_208._M_string_length;
          strlen(pcVar6);
          absFiles = local_1d8;
          std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)sVar3,(ulong)pcVar6);
          std::__cxx11::string::append((char *)&local_208);
          std::__cxx11::string::_M_append((char *)&local_208,(ulong)(pbVar9->_M_dataplus)._M_p);
        }
        if ((sVar5 == 0xffffffffffffffff) &&
           (bVar4 = cmsys::SystemTools::FileIsDirectory(&local_208), bVar4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar6 = local_1e0;
          if (local_1e0 == (char *)0x0) {
            std::ios::clear((int)&local_208 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x60);
          }
          else {
            sVar7 = strlen(local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," given directory \"",0x12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,
                              pbVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to install.",0xd);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&local_1e8->super_cmCommand,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p == paVar1) {
            return bVar10;
          }
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          return bVar10;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(absFiles,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = pbVar9 + 1;
      bVar10 = pbVar9 == (local_1d0->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar10);
  }
  return bVar10;
}

Assistant:

bool cmInstallCommand::MakeFilesFullPath(
  const char* modeName, const std::vector<std::string>& relFiles,
  std::vector<std::string>& absFiles)
{
  for (std::vector<std::string>::const_iterator fileIt = relFiles.begin();
       fileIt != relFiles.end(); ++fileIt) {
    std::string file = (*fileIt);
    std::string::size_type gpos = cmGeneratorExpression::Find(file);
    if (gpos != 0 && !cmSystemTools::FileIsFullPath(file.c_str())) {
      file = this->Makefile->GetCurrentSourceDirectory();
      file += "/";
      file += *fileIt;
    }

    // Make sure the file is not a directory.
    if (gpos == std::string::npos && cmSystemTools::FileIsDirectory(file)) {
      std::ostringstream e;
      e << modeName << " given directory \"" << (*fileIt) << "\" to install.";
      this->SetError(e.str());
      return false;
    }
    // Store the file for installation.
    absFiles.push_back(file);
  }
  return true;
}